

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SGXMLScanner::resolveSchemaGrammar
          (SGXMLScanner *this,XMLCh *loc,XMLCh *uri,bool ignoreLoadSchema)

{
  XMLBufferMgr *this_00;
  ReaderMgr *this_01;
  XMLEntityHandler *pXVar1;
  XMLStringPool *pXVar2;
  XMLValidator *pXVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  SchemaGrammar *this_02;
  undefined4 extraout_var;
  XMLBuffer *pXVar7;
  undefined4 extraout_var_00;
  XMLBuffer *normalizedURI;
  URLInputSource *this_03;
  XMLCh *pXVar8;
  SchemaInfo *pSVar9;
  DOMDocument *pDVar10;
  DOMElement *schemaRoot;
  XMLCh *str1;
  undefined4 extraout_var_04;
  long *plVar11;
  XSModel *pXVar12;
  MalformedURLException *this_04;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *schemaInfoList;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *cachedSchemaInfoList;
  XMLBufBid bbSys;
  XMLBufBid nnSys;
  XMLBufBid ddSys;
  LastExtEntityInfo lastInfo;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_3f8;
  XSDDOMParser parser;
  XMLSchemaDescriptionImpl theSchemaDescription;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  
  XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
            (&theSchemaDescription,uri,(this->super_XMLScanner).fMemoryManager);
  XMLSchemaDescriptionImpl::setLocationHints(&theSchemaDescription,loc);
  this_02 = (SchemaGrammar *)
            GrammarResolver::getGrammar
                      ((this->super_XMLScanner).fGrammarResolver,
                       (XMLGrammarDescription *)&theSchemaDescription);
  XMLSchemaDescriptionImpl::~XMLSchemaDescriptionImpl(&theSchemaDescription);
  if ((this_02 != (SchemaGrammar *)0x0) &&
     (iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02),
     iVar5 != 0)) {
    if ((this->super_XMLScanner).fHandleMultipleImports == true) {
      iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
      iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var,iVar5));
      if (iVar5 == 2) goto LAB_002b4ef3;
    }
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
      (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]
      ->fValidationFlag = true;
    }
    if (this->fGrammarType == DTDGrammarType) {
      (this->super_XMLScanner).fGrammar = (Grammar *)this_02;
      this->fGrammarType = SchemaGrammarType;
      pXVar3 = (this->super_XMLScanner).fValidator;
      (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,this_02);
    }
    goto LAB_002b5607;
  }
LAB_002b4ef3:
  if ((ignoreLoadSchema | (this->super_XMLScanner).fLoadSchema) != 1) goto LAB_002b5607;
  XSDDOMParser::XSDDOMParser
            (&parser,(XMLValidator *)0x0,(this->super_XMLScanner).fMemoryManager,
             (XMLGrammarPool *)0x0);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)&parser,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)&parser,true);
  XSDDOMParser::setUserEntityHandler(&parser,(this->super_XMLScanner).fEntityHandler);
  XSDDOMParser::setUserErrorReporter(&parser,(this->super_XMLScanner).fErrorReporter);
  this_00 = &(this->super_XMLScanner).fBufMgr;
  pXVar7 = XMLBufferMgr::bidOnBuffer(this_00);
  theSchemaDescription.super_XMLSchemaDescription.super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable._0_2_ = 0xffff;
  nnSys.fBuffer = pXVar7;
  nnSys.fMgr = this_00;
  XMLString::removeChar(loc,(XMLCh *)&theSchemaDescription,pXVar7);
  pXVar8 = pXVar7->fBuffer;
  pXVar8[pXVar7->fIndex] = L'\0';
  pXVar7 = XMLBufferMgr::bidOnBuffer(this_00);
  pXVar1 = (this->super_XMLScanner).fEntityHandler;
  bbSys.fBuffer = pXVar7;
  bbSys.fMgr = this_00;
  if (pXVar1 == (XMLEntityHandler *)0x0) {
    XMLBuffer::set(pXVar7,pXVar8);
LAB_002b50b8:
    if ((this->super_XMLScanner).fDisableDefaultEntityResolution != false) goto LAB_002b5268;
    ReaderMgr::getLastExtEntityInfo(&(this->super_XMLScanner).fReaderMgr,&lastInfo);
    XMLURL::XMLURL((XMLURL *)&theSchemaDescription,(this->super_XMLScanner).fMemoryManager);
    pXVar8 = pXVar7->fBuffer;
    pXVar8[pXVar7->fIndex] = L'\0';
    bVar4 = XMLURL::setURL((XMLURL *)&theSchemaDescription,lastInfo.systemId,pXVar8,
                           (XMLURL *)&theSchemaDescription);
    if ((!bVar4) || (bVar4 = XMLURL::isRelative((XMLURL *)&theSchemaDescription), bVar4)) {
      if ((this->super_XMLScanner).fStandardUriConformant != false) {
        this_04 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                   ,0xe5b,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        goto LAB_002b565f;
      }
      normalizedURI = XMLBufferMgr::bidOnBuffer(this_00);
      pXVar8 = pXVar7->fBuffer;
      pXVar8[pXVar7->fIndex] = L'\0';
      ddSys.fBuffer = normalizedURI;
      ddSys.fMgr = this_00;
      XMLUri::normalizeURI(pXVar8,normalizedURI);
      this_03 = (URLInputSource *)
                XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      pXVar8 = normalizedURI->fBuffer;
      pXVar8[normalizedURI->fIndex] = L'\0';
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_03,lastInfo.systemId,pXVar8,
                 (this->super_XMLScanner).fMemoryManager);
      XMLBufBid::~XMLBufBid(&ddSys);
    }
    else {
      if (((this->super_XMLScanner).fStandardUriConformant == true) &&
         (bVar4 = XMLURL::hasInvalidChar((XMLURL *)&theSchemaDescription), bVar4)) {
        this_04 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                   ,0xe60,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
LAB_002b565f:
        __cxa_throw(this_04,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
      this_03 = (URLInputSource *)
                XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
      URLInputSource::URLInputSource
                (this_03,(XMLURL *)&theSchemaDescription,(this->super_XMLScanner).fMemoryManager);
    }
    XMLURL::~XMLURL((XMLURL *)&theSchemaDescription);
  }
  else {
    iVar5 = (*pXVar1->_vptr_XMLEntityHandler[3])(pXVar1,pXVar8,pXVar7);
    if ((char)iVar5 == '\0') {
      XMLBuffer::set(pXVar7,pXVar8);
    }
    this_01 = &(this->super_XMLScanner).fReaderMgr;
    ReaderMgr::getLastExtEntityInfo(this_01,&lastInfo);
    theSchemaDescription._16_8_ = pXVar7->fBuffer;
    *(XMLCh *)(theSchemaDescription._16_8_ + pXVar7->fIndex * 2) = L'\0';
    theSchemaDescription.super_XMLSchemaDescription.super_XMLGrammarDescription.super_XSerializable.
    _vptr_XSerializable._0_4_ = 0;
    theSchemaDescription.super_XMLSchemaDescription.super_XMLGrammarDescription.fMemMgr =
         (MemoryManager *)&XMLUni::fgZeroLenString;
    theSchemaDescription.fNamespace = lastInfo.systemId;
    theSchemaDescription.fLocationHints = (RefArrayVectorOf<char16_t> *)uri;
    theSchemaDescription.fTriggeringComponent = (QName *)this_01;
    iVar5 = (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[5])();
    this_03 = (URLInputSource *)CONCAT44(extraout_var_00,iVar5);
    if (this_03 == (URLInputSource *)0x0) goto LAB_002b50b8;
  }
  iVar5 = (*(this_03->super_InputSource)._vptr_InputSource[5])(this_03);
  pXVar8 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
  if ((uri == (XMLCh *)0x0) || (*uri == L'\0')) {
    uVar6 = (this->super_XMLScanner).fEmptyNamespaceId;
  }
  else {
    pXVar2 = (this->super_XMLScanner).fURIStringPool;
    uVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,uri);
  }
  if ((((this->super_XMLScanner).fUseCachedGrammar == true) &&
      (pSVar9 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                          (this->fCachedSchemaInfoList,pXVar8,uVar6), pSVar9 != (SchemaInfo *)0x0))
     || (((this->super_XMLScanner).fToCacheGrammar == false &&
         (pSVar9 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                             (this->fSchemaInfoList,pXVar8,uVar6), pSVar9 != (SchemaInfo *)0x0)))) {
LAB_002b525e:
    (*(this_03->super_InputSource)._vptr_InputSource[1])(this_03);
LAB_002b5268:
    XMLBufBid::~XMLBufBid(&bbSys);
    XMLBufBid::~XMLBufBid(&nnSys);
    XSDDOMParser::~XSDDOMParser(&parser);
    return;
  }
  uVar6 = (*(this_03->super_InputSource)._vptr_InputSource[6])(this_03);
  (*(this_03->super_InputSource)._vptr_InputSource[10])(this_03,0);
  AbstractDOMParser::parse((AbstractDOMParser *)&parser,&this_03->super_InputSource);
  (*(this_03->super_InputSource)._vptr_InputSource[10])(this_03,(ulong)(uVar6 & 0xff));
  if ((parser.fSawFatal == true) && ((this->super_XMLScanner).fExitOnFirstFatal == true)) {
    XMLScanner::emitError(&this->super_XMLScanner,SchemaScanFatalError);
  }
  pDVar10 = AbstractDOMParser::getDocument((AbstractDOMParser *)&parser);
  if (pDVar10 != (DOMDocument *)0x0) {
    iVar5 = (*(pDVar10->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar10);
    schemaRoot = (DOMElement *)CONCAT44(extraout_var_02,iVar5);
    if (schemaRoot != (DOMElement *)0x0) {
      iVar5 = (*(schemaRoot->super_DOMNode)._vptr_DOMNode[0x29])
                        (schemaRoot,SchemaSymbols::fgATT_TARGETNAMESPACE);
      str1 = (XMLCh *)CONCAT44(extraout_var_03,iVar5);
      bVar4 = XMLString::equals(str1,uri);
      if (!bVar4) {
        if (((this->super_XMLScanner).fValidate != false) ||
           ((this->super_XMLScanner).fValScheme == Val_Auto)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,WrongTargetNamespace,loc,uri,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        this_02 = (SchemaGrammar *)
                  GrammarResolver::getGrammar((this->super_XMLScanner).fGrammarResolver,str1);
      }
      if ((this_02 == (SchemaGrammar *)0x0) ||
         (iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02),
         iVar5 == 0)) {
LAB_002b53b5:
        if (!bVar4) {
          if ((str1 == (XMLCh *)0x0) || (*str1 == L'\0')) {
            uVar6 = (this->super_XMLScanner).fEmptyNamespaceId;
          }
          else {
            uVar6 = (*(((this->super_XMLScanner).fURIStringPool)->super_XSerializable).
                      _vptr_XSerializable[5])();
          }
          if ((((this->super_XMLScanner).fUseCachedGrammar == true) &&
              (pSVar9 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                                  (this->fCachedSchemaInfoList,pXVar8,uVar6),
              pSVar9 != (SchemaInfo *)0x0)) ||
             (((this->super_XMLScanner).fToCacheGrammar == false &&
              (pSVar9 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                                  (this->fSchemaInfoList,pXVar8,uVar6), pSVar9 != (SchemaInfo *)0x0)
              ))) goto LAB_002b525e;
        }
        if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
           ((this->super_XMLScanner).fValidate == false)) {
          (this->super_XMLScanner).fValidate = true;
          (this->super_XMLScanner).fElemStack.fStack
          [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag = true;
        }
        if (this_02 == (SchemaGrammar *)0x0) {
LAB_002b5462:
          this_02 = (SchemaGrammar *)
                    XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
          SchemaGrammar::SchemaGrammar(this_02,(this->super_XMLScanner).fGrammarPoolMemoryManager);
          bVar4 = false;
        }
        else {
          iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02);
          bVar4 = true;
          if (iVar5 != 1) goto LAB_002b5462;
        }
        iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
        plVar11 = (long *)CONCAT44(extraout_var_05,iVar5);
        (**(code **)(*plVar11 + 0x68))(plVar11,3);
        (**(code **)(*plVar11 + 0x78))(plVar11,pXVar8);
        cachedSchemaInfoList = this->fSchemaInfoList;
        if ((this->super_XMLScanner).fUseCachedGrammar != false) {
          cachedSchemaInfoList = this->fCachedSchemaInfoList;
        }
        schemaInfoList = this->fSchemaInfoList;
        if ((this->super_XMLScanner).fToCacheGrammar != false) {
          schemaInfoList = this->fCachedSchemaInfoList;
        }
        TraverseSchema::TraverseSchema
                  ((TraverseSchema *)&theSchemaDescription,schemaRoot,
                   (this->super_XMLScanner).fURIStringPool,this_02,
                   (this->super_XMLScanner).fGrammarResolver,cachedSchemaInfoList,schemaInfoList,
                   &this->super_XMLScanner,pXVar8,(this->super_XMLScanner).fEntityHandler,
                   (this->super_XMLScanner).fErrorReporter,(this->super_XMLScanner).fMemoryManager,
                   bVar4);
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        RefHash2KeysTableOfEnumerator
                  ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    *)&lastInfo,(&this->fSchemaInfoList)[(this->super_XMLScanner).fToCacheGrammar],
                   false,XMLPlatformUtils::fgMemoryManager);
        while ((lastInfo.lineNumber != 0 || (lastInfo.colNumber != local_3f8->fHashModulus))) {
          pSVar9 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                   ::nextElement((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                  *)&lastInfo);
          pSVar9->fSchemaRootElement = (DOMElement *)0x0;
        }
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        ~RefHash2KeysTableOfEnumerator
                  ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    *)&lastInfo);
        if (this->fGrammarType == DTDGrammarType) {
          (this->super_XMLScanner).fGrammar = &this_02->super_Grammar;
          this->fGrammarType = SchemaGrammarType;
          pXVar3 = (this->super_XMLScanner).fValidator;
          (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,this_02);
        }
        if ((this->super_XMLScanner).fValidate == true) {
          pXVar3 = (this->super_XMLScanner).fValidator;
          (*pXVar3->_vptr_XMLValidator[4])(pXVar3,0,0);
        }
        TraverseSchema::~TraverseSchema((TraverseSchema *)&theSchemaDescription);
      }
      else if ((this->super_XMLScanner).fHandleMultipleImports == true) {
        iVar5 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
        iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x38))
                          ((long *)CONCAT44(extraout_var_04,iVar5));
        if (iVar5 == 2) goto LAB_002b53b5;
      }
    }
  }
  (*(this_03->super_InputSource)._vptr_InputSource[1])(this_03);
  XMLBufBid::~XMLBufBid(&bbSys);
  XMLBufBid::~XMLBufBid(&nnSys);
  XSDDOMParser::~XSDDOMParser(&parser);
LAB_002b5607:
  if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
    pXVar12 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
    this->fModel = pXVar12;
  }
  return;
}

Assistant:

void SGXMLScanner::resolveSchemaGrammar(const XMLCh* const loc, const XMLCh* const uri, bool ignoreLoadSchema) {

    Grammar* grammar = 0;

    {
        XMLSchemaDescriptionImpl    theSchemaDescription(uri, fMemoryManager);
        theSchemaDescription.setLocationHints(loc);
        grammar = fGrammarResolver->getGrammar(&theSchemaDescription);
    }

    // If multi-import is enabled, make sure the existing grammar came
    // from the import directive. Otherwise we may end up reloading
    // the same schema that came from the external grammar pool. Ideally,
    // we would move fSchemaInfoList to XMLGrammarPool so that it survives
    // the destruction of the scanner in which case we could rely on the
    // same logic we use to weed out duplicate schemas below.
    //
    if (!grammar || grammar->getGrammarType() == Grammar::DTDGrammarType ||
        (getHandleMultipleImports() &&
         ((XMLSchemaDescription*)grammar->getGrammarDescription())->
         getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
    {
      if (fLoadSchema || ignoreLoadSchema)
      {
        XSDDOMParser parser(0, fMemoryManager, 0);

        parser.setValidationScheme(XercesDOMParser::Val_Never);
        parser.setDoNamespaces(true);
        parser.setUserEntityHandler(fEntityHandler);
        parser.setUserErrorReporter(fErrorReporter);

        //Normalize sysId
        XMLBufBid nnSys(&fBufMgr);
        XMLBuffer& normalizedSysId = nnSys.getBuffer();
        XMLString::removeChar(loc, 0xFFFF, normalizedSysId);
        const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

        // Create a buffer for expanding the system id
        XMLBufBid bbSys(&fBufMgr);
        XMLBuffer& expSysId = bbSys.getBuffer();

        //  Allow the entity handler to expand the system id if they choose
        //  to do so.
        InputSource* srcToFill = 0;
        if (fEntityHandler)
        {
            if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
                expSysId.set(normalizedURI);

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);
            XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::SchemaGrammar,
                            expSysId.getRawBuffer(), uri, XMLUni::fgZeroLenString, lastInfo.systemId,
                            &fReaderMgr);
            srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
        }
        else
        {
            expSysId.set(normalizedURI);
        }

        //  If they didn't create a source via the entity handler, then we
        //  have to create one on our own.
        if (!srcToFill)
        {
            if (fDisableDefaultEntityResolution)
                return;

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);

            XMLURL urlTmp(fMemoryManager);
            if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
                (urlTmp.isRelative()))
            {
                if (!fStandardUriConformant)
                {
                    XMLBufBid  ddSys(&fBufMgr);
                    XMLBuffer& resolvedSysId = ddSys.getBuffer();
                    XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                    srcToFill = new (fMemoryManager) LocalFileInputSource
                    (
                        lastInfo.systemId
                        , resolvedSysId.getRawBuffer()
                        , fMemoryManager
                    );
                }
                else
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            }
            else
            {
                if (fStandardUriConformant && urlTmp.hasInvalidChar())
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);

                srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
            }
        }

        // Put a janitor on the input source
        Janitor<InputSource> janSrc(srcToFill);

        // Check if this exact schema has already been seen.
        //
        const XMLCh* sysId = srcToFill->getSystemId();
        unsigned int uriId = (uri && *uri) ? fURIStringPool->addOrFind(uri) : fEmptyNamespaceId;
        SchemaInfo* importSchemaInfo = 0;

        if (fUseCachedGrammar)
          importSchemaInfo = fCachedSchemaInfoList->get(sysId, uriId);

        if (!importSchemaInfo && !fToCacheGrammar)
          importSchemaInfo = fSchemaInfoList->get(sysId, uriId);

        if (importSchemaInfo)
        {
          // We haven't added any new grammars so it is safe to just
          // return.
          //
          return;
        }

        // Should just issue warning if the schema is not found
        bool flag = srcToFill->getIssueFatalErrorIfNotFound();
        srcToFill->setIssueFatalErrorIfNotFound(false);

        parser.parse(*srcToFill);

        // Reset the InputSource
        srcToFill->setIssueFatalErrorIfNotFound(flag);

        if (parser.getSawFatal() && fExitOnFirstFatal)
            emitError(XMLErrs::SchemaScanFatalError);

        DOMDocument* document = parser.getDocument(); //Our Grammar

        if (document != 0) {

            DOMElement* root = document->getDocumentElement();// This is what we pass to TraverserSchema
            if (root != 0)
            {
                const XMLCh* newUri = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);
                bool newGrammar = false;
                if (!XMLString::equals(newUri, uri)) {
                    if (fValidate || fValScheme == Val_Auto) {
                        fValidator->emitError(XMLValid::WrongTargetNamespace, loc, uri);
                    }

                    grammar = fGrammarResolver->getGrammar(newUri);
                    newGrammar = true;
                }

                if (!grammar ||
                    grammar->getGrammarType() == Grammar::DTDGrammarType ||
                    (getHandleMultipleImports() &&
                     ((XMLSchemaDescription*) grammar->getGrammarDescription())->
                     getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
                {
                    // If we switched namespace URI, recheck the schema info.
                    //
                    if (newGrammar)
                    {
                      unsigned int newUriId = (newUri && *newUri) ? fURIStringPool->addOrFind(newUri) : fEmptyNamespaceId;

                      if (fUseCachedGrammar)
                        importSchemaInfo = fCachedSchemaInfoList->get(sysId, newUriId);

                      if (!importSchemaInfo && !fToCacheGrammar)
                        importSchemaInfo = fSchemaInfoList->get(sysId, newUriId);

                      if (importSchemaInfo)
                        return;
                    }

                    //  Since we have seen a grammar, set our validation flag
                    //  at this point if the validation scheme is auto
                    if (fValScheme == Val_Auto && !fValidate) {
                        fValidate = true;
                        fElemStack.setValidationFlag(fValidate);
                    }

                    bool grammarFound = grammar &&
                      grammar->getGrammarType() == Grammar::SchemaGrammarType;

                    SchemaGrammar* schemaGrammar;

                    if (grammarFound) {
                      schemaGrammar = (SchemaGrammar*) grammar;
                    }
                    else {
                      schemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);
                    }

                    XMLSchemaDescription* gramDesc = (XMLSchemaDescription*) schemaGrammar->getGrammarDescription();

                    gramDesc->setContextType(XMLSchemaDescription::CONTEXT_PREPARSE);
                    gramDesc->setLocationHints(sysId);

                    TraverseSchema traverseSchema
                    (
                        root
                        , fURIStringPool
                        , schemaGrammar
                        , fGrammarResolver
                        , fUseCachedGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , this
                        , sysId
                        , fEntityHandler
                        , fErrorReporter
                        , fMemoryManager
                        , grammarFound
                    );

                    // Reset the now invalid schema roots in the collected
                    // schema info entries.
                    //
                    {
                      RefHash2KeysTableOfEnumerator<SchemaInfo> i (
                        fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList);

                      while (i.hasMoreElements ())
                        i.nextElement().resetRoot ();
                    }

                    if (fGrammarType == Grammar::DTDGrammarType) {
                        fGrammar = schemaGrammar;
                        fGrammarType = Grammar::SchemaGrammarType;
                        fValidator->setGrammar(fGrammar);
                    }

                    if (fValidate) {
                        //  validate the Schema scan so far
                        fValidator->preContentValidation(false);
                    }
                }
            }
        }
      }
    }
    else
    {
        //  Since we have seen a grammar, set our validation flag
        //  at this point if the validation scheme is auto
        if (fValScheme == Val_Auto && !fValidate) {
            fValidate = true;
            fElemStack.setValidationFlag(fValidate);
        }

        // we have seen a schema, so set up the fValidator as fSchemaValidator
        if (fGrammarType == Grammar::DTDGrammarType) {
            fGrammar = grammar;
            fGrammarType = Grammar::SchemaGrammarType;
            fValidator->setGrammar(fGrammar);
        }
    }
    // update fModel; rely on the grammar resolver to do this
    // efficiently
    if(getPSVIHandler())
        fModel = fGrammarResolver->getXSModel();
}